

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlFileWrite(void *context,char *buffer,int len)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  FILE *file;
  
  iVar1 = -1;
  if (buffer != (char *)0x0 && context != (void *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    sVar3 = fwrite(buffer,1,(long)len,(FILE *)context);
    iVar1 = len;
    if (sVar3 < (ulong)(long)len) {
      iVar1 = xmlIOErr(*piVar2);
      iVar1 = -iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int
xmlFileWrite(void *context, const char *buffer, int len) {
    FILE *file = context;
    size_t bytes;

    if ((context == NULL) || (buffer == NULL))
        return(-1);

    errno = 0;
    bytes = fwrite(buffer, 1, len, file);
    if (bytes < (size_t) len)
        return(-xmlIOErr(errno));

    return(len);
}